

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestViewSampling::deinitTextureObjects(TextureViewTestViewSampling *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_result_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_result_to_id);
    this->m_result_to_id = 0;
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_view_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_view_to_id);
    this->m_view_to_id = 0;
  }
  return;
}

Assistant:

void TextureViewTestViewSampling::deinitTextureObjects()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_result_to_id != 0)
	{
		gl.deleteTextures(1, &m_result_to_id);

		m_result_to_id = 0;
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	if (m_view_to_id != 0)
	{
		gl.deleteTextures(1, &m_view_to_id);

		m_view_to_id = 0;
	}
}